

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

node * make_simple_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *nodephoneids,
                       int32 nphones,int32 ndensity,int32 nfeat,int32 ndim,int32 npermute,
                       int32 depth,int32 continuous)

{
  float fVar1;
  float fVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  float32 *pfVar5;
  float32 *pfVar6;
  float32 *pfVar7;
  float32 *pfVar8;
  double dVar9;
  float32 ***pppfVar10;
  int32 **ppiVar11;
  int32 *piVar12;
  float32 **ppfVar13;
  node *pnVar14;
  int32 *piVar15;
  float32 ***pmixw;
  cmd_ln_t *cmdln;
  ulong uVar16;
  node *pnVar17;
  int iVar18;
  ulong uVar19;
  float32 ***pppfVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  int32 **ppiVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  int32 **ppiVar30;
  float32 **ppfVar31;
  size_t sVar32;
  size_t d2;
  float fVar33;
  float32 fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  int32 npermute_00;
  float32 **local_f0;
  float32 **local_e8;
  int32 b;
  float32 **local_d0;
  float32 **local_c8;
  uint local_c0;
  int32 a;
  float32 **local_b8;
  size_t local_b0;
  int32 **local_a8;
  int32 *local_a0;
  int32 **local_98;
  float32 ***local_90;
  ulong local_88;
  int32 *local_80;
  float32 **local_78;
  float32 **local_70;
  ulong local_68;
  ulong local_60;
  int32 rnphones;
  int32 lnphones;
  node *local_50;
  long local_48;
  int32 *rphoneids;
  int32 *lphoneids;
  
  local_78 = means;
  local_70 = vars;
  pnVar14 = (node *)__ckd_calloc__(1,0x30,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x16b);
  sVar32 = (size_t)nphones;
  local_c0 = nphones;
  piVar15 = (int32 *)__ckd_calloc__(sVar32,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x16c);
  pnVar14->phoneids = piVar15;
  pnVar14->nphones = nphones;
  local_c8 = (float32 **)nodephoneids;
  memcpy(piVar15,nodephoneids,sVar32 * 4);
  pnVar14->depth = depth;
  local_50 = pnVar14;
  pmixw = (float32 ***)
          __ckd_calloc_3d__(sVar32,(long)nfeat,(long)ndensity,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x172);
  local_90 = (float32 ***)
             __ckd_calloc_3d__(sVar32,(long)nfeat,(long)ndensity,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x173);
  local_a8 = (int32 **)
             __ckd_calloc_2d__(sVar32,sVar32,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x174);
  local_80 = (int32 *)__ckd_calloc__(sVar32,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                     ,0x175);
  local_98 = (int32 **)
             __ckd_calloc_2d__(sVar32,sVar32,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x176);
  local_a0 = (int32 *)__ckd_calloc__(sVar32,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                     ,0x177);
  uVar22 = 0;
  local_b0 = sVar32;
  if (continuous == 0) {
    fVar33 = 0.0;
    local_b8 = (float32 **)0x0;
    local_f0 = (float32 **)0x0;
    local_e8 = (float32 **)0x0;
    local_d0 = (float32 **)0x0;
  }
  else {
    cmdln = cmd_ln_get();
    dVar9 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar33 = (float)dVar9;
    d2 = (size_t)ndim;
    local_d0 = (float32 **)
               __ckd_calloc_2d__(sVar32,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17b);
    local_e8 = (float32 **)
               __ckd_calloc_2d__(sVar32,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17c);
    local_f0 = (float32 **)
               __ckd_calloc_2d__(sVar32,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17d);
    local_b8 = (float32 **)
               __ckd_calloc_2d__(sVar32,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17e);
  }
  local_88 = (ulong)(uint)npermute;
  uVar23 = 0;
  if (0 < ndensity) {
    uVar23 = (ulong)(uint)ndensity;
  }
  local_60 = 0;
  if (0 < nfeat) {
    local_60 = (ulong)(uint)nfeat;
  }
  local_68 = 0;
  if (0 < ndim) {
    local_68 = (ulong)(uint)ndim;
  }
  uVar16 = 0;
  if (0 < (int)local_c0) {
    uVar16 = (ulong)local_c0;
  }
  for (; uVar22 != uVar16; uVar22 = uVar22 + 1) {
    local_80[uVar22] = 1;
    iVar18 = *(int *)((long)local_c8 + uVar22 * 4);
    *local_a8[uVar22] = iVar18;
    for (uVar19 = 0; uVar19 != local_60; uVar19 = uVar19 + 1) {
      for (uVar29 = 0; uVar23 != uVar29; uVar29 = uVar29 + 1) {
        pmixw[uVar22][uVar19][uVar29] = mixw[iVar18][uVar19][uVar29];
      }
    }
    if (continuous != 0) {
      for (uVar19 = 0; local_68 != uVar19; uVar19 = uVar19 + 1) {
        local_d0[uVar22][uVar19] = local_78[iVar18][uVar19];
        local_e8[uVar22][uVar19] = local_70[iVar18][uVar19];
      }
    }
  }
  ppiVar30 = local_a8;
  if (npermute < (int)local_c0) {
    local_48 = (long)npermute;
    sVar32 = local_b0;
    pppfVar10 = local_90;
    ppiVar11 = local_98;
    local_c8 = local_d0;
    piVar12 = local_80;
    ppfVar13 = local_b8;
    while (ppfVar31 = ppfVar13, piVar15 = piVar12, ppiVar24 = ppiVar11, pppfVar20 = pppfVar10,
          local_d0 = local_c8, ppfVar13 = local_f0, local_48 < (long)sVar32) {
      ppfVar13 = local_c8;
      local_c8 = local_f0;
      local_b0 = sVar32;
      local_a8 = ppiVar30;
      findclosestpair(ppfVar13,local_e8,pmixw,(int32)sVar32,ndensity,nfeat,ndim,&a,&b,continuous);
      uVar22 = 0;
      iVar18 = 0;
      while( true ) {
        if ((long)local_b0 <= (long)uVar22) break;
        if ((uVar22 != (uint)a) && (uVar22 != (uint)b)) {
          iVar27 = piVar15[uVar22];
          local_a0[iVar18] = iVar27;
          for (lVar25 = 0; lVar25 < iVar27; lVar25 = lVar25 + 1) {
            ppiVar24[iVar18][lVar25] = local_a8[uVar22][lVar25];
            iVar27 = piVar15[uVar22];
          }
          for (uVar16 = 0; uVar16 != local_60; uVar16 = uVar16 + 1) {
            for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
              pppfVar20[iVar18][uVar16][uVar19] = pmixw[uVar22][uVar16][uVar19];
            }
          }
          if (continuous != 0) {
            for (uVar16 = 0; local_68 != uVar16; uVar16 = uVar16 + 1) {
              local_c8[iVar18][uVar16] = local_d0[uVar22][uVar16];
              ppfVar31[iVar18][uVar16] = local_e8[uVar22][uVar16];
            }
          }
          iVar18 = iVar18 + 1;
        }
        uVar22 = uVar22 + 1;
      }
      local_a0[iVar18] = piVar15[b] + piVar15[a];
      lVar25 = (long)a;
      lVar26 = 0;
      for (lVar21 = 0; lVar21 < piVar15[lVar25]; lVar21 = lVar21 + 1) {
        ppiVar24[iVar18][lVar21] = local_a8[lVar25][lVar21];
        lVar26 = lVar26 + 4;
      }
      lVar21 = (long)b;
      for (lVar28 = 0; lVar28 < piVar15[lVar21]; lVar28 = lVar28 + 1) {
        *(int32 *)((long)ppiVar24[iVar18] + lVar26) = local_a8[lVar21][lVar28];
        lVar26 = lVar26 + 4;
      }
      if (continuous == 0) {
        for (uVar22 = 0; uVar22 != local_60; uVar22 = uVar22 + 1) {
          for (uVar16 = 0; uVar23 != uVar16; uVar16 = uVar16 + 1) {
            pppfVar20[iVar18][uVar22][uVar16] =
                 (float32)((float)pmixw[lVar25][uVar22][uVar16] +
                          (float)pmixw[lVar21][uVar22][uVar16]);
          }
        }
      }
      else {
        pfVar3 = local_c8[iVar18];
        pfVar4 = ppfVar31[iVar18];
        pfVar5 = local_d0[lVar25];
        pfVar6 = local_e8[lVar25];
        pfVar7 = local_d0[lVar21];
        pfVar8 = local_e8[lVar21];
        fVar1 = (float)**pmixw[lVar25];
        fVar2 = (float)**pmixw[lVar21];
        fVar35 = fVar1 + fVar2;
        **pppfVar20[iVar18] = (float32)fVar35;
        for (uVar22 = 0; local_68 != uVar22; uVar22 = uVar22 + 1) {
          pfVar3[uVar22] =
               (float32)(((float)pfVar5[uVar22] * fVar1 + (float)pfVar7[uVar22] * fVar2) / fVar35);
          fVar37 = (float)pfVar5[uVar22];
          fVar36 = (float)pfVar7[uVar22];
          fVar36 = (fVar37 * fVar37 + (float)pfVar6[uVar22]) * fVar1 +
                   (fVar36 * fVar36 + (float)pfVar8[uVar22]) * fVar2;
          pfVar4[uVar22] = (float32)fVar36;
          fVar37 = (float)pfVar3[uVar22];
          fVar36 = fVar36 / fVar35 - fVar37 * fVar37;
          fVar37 = fVar33;
          if (fVar33 <= fVar36) {
            fVar37 = fVar36;
          }
          pfVar4[uVar22] = (float32)fVar37;
        }
      }
      pppfVar10 = pmixw;
      ppiVar11 = local_a8;
      piVar12 = local_a0;
      local_f0 = local_d0;
      ppiVar30 = ppiVar24;
      ppfVar13 = local_e8;
      pmixw = pppfVar20;
      local_e8 = ppfVar31;
      local_a0 = piVar15;
      sVar32 = local_b0 - 1;
    }
  }
  else {
    local_88 = (ulong)local_c0;
    ppfVar13 = local_c8;
    ppfVar31 = local_b8;
    ppiVar24 = local_98;
    pppfVar20 = local_90;
    piVar15 = local_80;
  }
  local_80 = piVar15;
  local_90 = pppfVar20;
  local_98 = ppiVar24;
  local_b8 = ppfVar31;
  local_c8 = ppfVar13;
  pnVar14 = local_50;
  ppfVar13 = local_78;
  if ((int)local_c0 < 2) {
    local_50->left = (node_str *)0x0;
    local_50->right = (node_str *)0x0;
  }
  else {
    fVar34 = permute(local_78,local_70,mixw,ndensity,nfeat,ndim,ppiVar30,local_80,(int32)local_88,
                     &lphoneids,&rphoneids,&lnphones,&rnphones,continuous);
    pnVar14->lkhd_dec = fVar34;
    if (continuous != 0) {
      ckd_free_2d(local_d0);
      ckd_free_2d(local_e8);
      ckd_free_2d(local_f0);
      ckd_free_2d(local_b8);
    }
    ckd_free_3d(pmixw);
    ckd_free_3d(local_90);
    ckd_free_2d(local_98);
    ckd_free_2d(ppiVar30);
    ppfVar31 = local_70;
    npermute_00 = (int32)local_88;
    pnVar17 = make_simple_tree(ppfVar13,local_70,mixw,lphoneids,lnphones,ndensity,nfeat,ndim,
                               npermute_00,pnVar14->depth + 1,continuous);
    pnVar14->left = pnVar17;
    pnVar17 = make_simple_tree(local_78,ppfVar31,mixw,rphoneids,rnphones,ndensity,nfeat,ndim,
                               npermute_00,pnVar14->depth + 1,continuous);
    pnVar14->right = pnVar17;
  }
  return pnVar14;
}

Assistant:

node *make_simple_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *nodephoneids, int32 nphones, int32 ndensity, 
           int32 nfeat, int32 ndim, int32 npermute, int32 depth, int32 continuous)
{
    float32  **oldmeans=NULL, **oldvars=NULL, **newmeans=NULL, **newvars=NULL;
    float32  ***oldmixw, ***newmixw, **tmp2d, ***tmp3d;
    float32  minvar=0, bestdec;
    int32    **phoneid, **newphoneid, *numphones, *newnumphones, **it2d, *it1d;
    int32    i,j,k,l,a,b,set,nsets;
    int32    *lphoneids,*rphoneids,lnphones,rnphones;
    node     *root;

    /* Allocate and set basic root parameters */
    root = (node *) ckd_calloc(1,sizeof(node));
    root->phoneids = (int32 *) ckd_calloc(nphones,sizeof(int32));
    root->nphones = nphones;
    memcpy(root->phoneids,nodephoneids,nphones*sizeof(int32));
    root->depth = depth;

    /* Build the node by clustering and partitioning */
    oldmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    newmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    phoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    numphones = (int32 *) ckd_calloc(nphones,sizeof(int32));
    newphoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    newnumphones = (int32 *) ckd_calloc(nphones,sizeof(int32));

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        oldmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        oldvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
    }

    for (i=0;i<nphones;i++){
        numphones[i] = 1;
        phoneid[i][0] =  nodephoneids[i]; /* Phone ids */
        for (j=0;j<nfeat;j++)
            for (k=0;k<ndensity;k++)
                oldmixw[i][j][k] = mixw[nodephoneids[i]][j][k];
        if (continuous) {
            for (l=0;l<ndim;l++){
                oldmeans[i][l] = means[nodephoneids[i]][l];
                oldvars[i][l] = vars[nodephoneids[i]][l];
            }
        }
    }
    if (nphones > npermute){

        for (nsets = nphones; nsets > npermute; nsets--) {
            /* Find the closest distributions */
            findclosestpair(oldmeans,oldvars,oldmixw,nsets,ndensity,
                                                         nfeat,ndim,&a,&b, continuous);

            /* Copy and Merge distributions... */
            /* Copy unmerged distributions first */
            for (i=0,set=0;i<nsets;i++){
                if (i != a && i != b){
                    newnumphones[set] = numphones[i];
                    for (l=0;l<numphones[i];l++)
                        newphoneid[set][l] = phoneid[i][l];
                    for (j=0;j<nfeat;j++)
                        for (k=0;k<ndensity;k++)
                            newmixw[set][j][k] = oldmixw[i][j][k];
                    if (continuous) {
                        for (l=0;l<ndim;l++){
                            newmeans[set][l] = oldmeans[i][l];
                            newvars[set][l] = oldvars[i][l];
                        }
                    }
                    set++;
                }
            }
            /* Merge a and b */
            newnumphones[set] =  numphones[a]+numphones[b];
            for (i=0;i<numphones[a];i++)
                newphoneid[set][i] = phoneid[a][i];
            for (l=0;l<numphones[b];l++,i++)
                newphoneid[set][i] = phoneid[b][l];
            if (continuous) {
                float32 *nm = newmeans[set];
                float32 *nv = newvars[set];
                float32 *oma = oldmeans[a];
                float32 *ova = oldvars[a];
                float32 *omb = oldmeans[b];
                float32 *ovb = oldvars[b];
                float32 cnta, cntb;

                cnta = oldmixw[a][0][0]; cntb = oldmixw[b][0][0];
                newmixw[set][0][0] = cnta + cntb;
                for (l=0;l<ndim;l++){
                    nm[l] = (cnta*oma[l] + cntb*omb[l]) / (cnta + cntb);
                    nv[l] = cnta*(ova[l]+oma[l]*oma[l]) +
                            cntb*(ovb[l]+omb[l]*omb[l]);
                    nv[l] = nv[l]/(cnta+cntb) - nm[l]*nm[l];
                    if (nv[l] < minvar) nv[l] = minvar;
                }
            }
            else {
                for (j=0;j<nfeat;j++)
                    for (k=0;k<ndensity;k++)
                        newmixw[set][j][k] = oldmixw[a][j][k]+oldmixw[b][j][k];
            }

            /* Switch old and new variables */
            tmp2d = oldmeans; oldmeans = newmeans; newmeans = tmp2d;
            tmp2d = oldvars;  oldvars = newvars;   newvars = tmp2d;
            tmp3d = oldmixw;  oldmixw = newmixw;   newmixw = tmp3d;
            it2d = phoneid;  phoneid = newphoneid; newphoneid = it2d;
            it1d = numphones; numphones = newnumphones; newnumphones = it1d;
        }
    }
    else npermute = nphones;

    if (nphones < 2){
        root->left = root->right = NULL; /* Dont split further */
        return(root);
    }

    bestdec = permute(means,vars,mixw,ndensity,nfeat,ndim,phoneid,numphones,
                      npermute,&lphoneids,&rphoneids,&lnphones,&rnphones, continuous);

    root->lkhd_dec = bestdec;

    if (continuous) {
        ckd_free_2d((void **)oldmeans); ckd_free_2d((void **)oldvars);
        ckd_free_2d((void **)newmeans); ckd_free_2d((void **)newvars);
    }
    ckd_free_3d((void ***)oldmixw); ckd_free_3d((void ***)newmixw);
    ckd_free_2d((void **)newphoneid); ckd_free_2d((void **)phoneid);

    /* Recurse */
    root->left = make_simple_tree(means,vars,mixw,lphoneids,lnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);
    root->right = make_simple_tree(means,vars,mixw,rphoneids,rnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);

    return(root);
}